

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::scroll_event(Application *this,float offset_x,float offset_y)

{
  int iVar1;
  float offset_y_local;
  float offset_x_local;
  Application *this_local;
  
  iVar1 = *(int *)&(this->super_Renderer).field_0xc;
  if (iVar1 == 0) {
    if (this->action < CreateJoint) {
      Camera::move_forward(&this->camera,(double)-offset_y * this->scroll_rate);
    }
  }
  else if ((iVar1 != 1) && (iVar1 - 2U < 2)) {
    Camera::move_forward(&this->camera,(double)-offset_y * this->scroll_rate);
  }
  return;
}

Assistant:

void Application::scroll_event(float offset_x, float offset_y) {

  //update_style();

  switch(mode) {
    case MODEL_MODE:
       switch( action )
       {
          case Action::Navigate:
          case Action::Edit:
          case Action::Bevel:
             camera.move_forward(-offset_y * scroll_rate);
             break;
          default:
             break;
       }
      //scene->_bevel_selection(offset_y * scroll_rate);
      break;
    case ANIMATE_MODE:
    case VISUALIZE_MODE:
      camera.move_forward(-offset_y * scroll_rate);
      break;
    case RENDER_MODE:
      break;
  }
}